

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketConnectionTestCase.cpp
# Opt level: O3

void __thiscall
SuiteSocketConnectionTests::TestSessionConnectionReadSocket_SessionMissing_NoMessagesReadHelper::
RunImpl(TestSessionConnectionReadSocket_SessionMissing_NoMessagesReadHelper *this)

{
  int iVar1;
  SocketConnection *pSVar2;
  TestResults *this_00;
  char cVar3;
  SocketConnection *pSVar4;
  TestResults **ppTVar5;
  TestDetails **ppTVar6;
  set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_> sessions;
  SocketConnector connector;
  TestDetails TStack_1a8;
  _Rb_tree<FIX::SessionID,_FIX::SessionID,_std::_Identity<FIX::SessionID>,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
  local_188;
  _Rb_tree<FIX::SessionID,_FIX::SessionID,_std::_Identity<FIX::SessionID>,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
  local_158;
  SocketConnector local_128 [272];
  
  local_158._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_158._M_impl.super__Rb_tree_header._M_header;
  local_158._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_158._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_158._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_158._M_impl.super__Rb_tree_header._M_header._M_right =
       local_158._M_impl.super__Rb_tree_header._M_header._M_left;
  pSVar4 = (SocketConnection *)operator_new(0x2180);
  iVar1 = (this->super_TestSessionConnection).super_BaseSocketConnection.socket;
  std::
  _Rb_tree<FIX::SessionID,_FIX::SessionID,_std::_Identity<FIX::SessionID>,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
  ::_Rb_tree(&local_188,&local_158);
  FIX::SocketConnection::SocketConnection
            (pSVar4,iVar1,&local_188,
             &(this->super_TestSessionConnection).super_BaseSocketConnection.monitor);
  pSVar2 = (this->super_TestSessionConnection).pSocketConnection._M_t.
           super___uniq_ptr_impl<FIX::SocketConnection,_std::default_delete<FIX::SocketConnection>_>
           ._M_t.
           super__Tuple_impl<0UL,_FIX::SocketConnection_*,_std::default_delete<FIX::SocketConnection>_>
           .super__Head_base<0UL,_FIX::SocketConnection_*,_false>._M_head_impl;
  (this->super_TestSessionConnection).pSocketConnection._M_t.
  super___uniq_ptr_impl<FIX::SocketConnection,_std::default_delete<FIX::SocketConnection>_>._M_t.
  super__Tuple_impl<0UL,_FIX::SocketConnection_*,_std::default_delete<FIX::SocketConnection>_>.
  super__Head_base<0UL,_FIX::SocketConnection_*,_false>._M_head_impl = pSVar4;
  if (pSVar2 != (SocketConnection *)0x0) {
    (**(code **)(*(long *)pSVar2 + 8))();
  }
  std::
  _Rb_tree<FIX::SessionID,_FIX::SessionID,_std::_Identity<FIX::SessionID>,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
  ::~_Rb_tree(&local_188);
  FIX::SocketConnector::SocketConnector(local_128,0);
  cVar3 = FIX::SocketConnection::read
                    ((SocketConnector *)
                     (this->super_TestSessionConnection).pSocketConnection._M_t.
                     super___uniq_ptr_impl<FIX::SocketConnection,_std::default_delete<FIX::SocketConnection>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_FIX::SocketConnection_*,_std::default_delete<FIX::SocketConnection>_>
                     .super__Head_base<0UL,_FIX::SocketConnection_*,_false>._M_head_impl);
  if (cVar3 != '\0') {
    ppTVar5 = UnitTest::CurrentTest::Results();
    this_00 = *ppTVar5;
    ppTVar6 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&TStack_1a8,*ppTVar6,0x102);
    UnitTest::TestResults::OnTestFailure(this_00,&TStack_1a8,"!pSocketConnection->read(connector)");
  }
  FIX::SocketMonitor::~SocketMonitor((SocketMonitor *)local_128);
  std::
  _Rb_tree<FIX::SessionID,_FIX::SessionID,_std::_Identity<FIX::SessionID>,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
  ::~_Rb_tree(&local_158);
  return;
}

Assistant:

TEST_FIXTURE(TestSessionConnection, ReadSocket_SessionMissing_NoMessagesRead)
  {
    std::set<SessionID> sessions;
    pSocketConnection.reset(new SocketConnection( socket, sessions, &monitor ));

    SocketConnector connector;
    CHECK(!pSocketConnection->read(connector));
  }